

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O2

void Mpm_ManStop(Mpm_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  Hsh_IntMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *pvVar2;
  Vec_Ptr_t *__ptr_01;
  Mmr_Step_t *__ptr_02;
  void **__ptr_03;
  int *piVar3;
  FILE *__stream;
  word *pwVar4;
  Mpm_Par_t *pMVar5;
  uint uVar6;
  byte bVar7;
  Vec_Int_t *__ptr_04;
  int i_2;
  int iVar8;
  long lVar9;
  int i;
  long lVar10;
  int i_1;
  int i_00;
  ulong uVar11;
  long lVar12;
  
  pMVar5 = p->pPars;
  if ((pMVar5->fUseTruth != 0) && (pMVar5->fVeryVerbose != 0)) {
    __stream = fopen("truths.txt","wb");
    pVVar1 = p->vTtMem;
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar1->nEntries);
    }
    for (i_00 = 0; i_00 < pVVar1->nEntries; i_00 = i_00 + 1) {
      pwVar4 = Vec_MemReadEntry(pVVar1,i_00);
      if (pwVar4 == (word *)0x0) break;
      uVar11 = (ulong)(uint)pVVar1->nEntrySize;
      while (0 < (int)uVar11) {
        uVar11 = uVar11 - 1;
        bVar7 = 0x3c;
        for (iVar8 = 0xf; -1 < iVar8; iVar8 = iVar8 + -1) {
          uVar6 = (uint)(pwVar4[uVar11] >> (bVar7 & 0x3f)) & 0xf;
          if (uVar6 < 10) {
            fprintf(__stream,"%d");
          }
          else {
            fputc(uVar6 + 0x37,__stream);
          }
          bVar7 = bVar7 - 4;
        }
      }
      fputc(10,__stream);
    }
    fclose(__stream);
    uVar6 = p->vTtMem->nEntries;
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)(int)uVar6 * ((double)p->nTruWords * 16.0 + 1.0) * 9.5367431640625e-07,
           (ulong)uVar6,(ulong)(uint)p->nLutSize,"truths.txt");
    pMVar5 = p->pPars;
  }
  if ((pMVar5->fUseDsd != 0) && (pMVar5->fVerbose != 0)) {
    Mpm_ManPrintDsdStats(p);
  }
  pVVar1 = p->vTtMem;
  if (pVVar1 != (Vec_Mem_t *)0x0) {
    Vec_IntFreeP(&pVVar1->vTable);
    Vec_IntFreeP(&pVVar1->vNexts);
    pVVar1 = p->vTtMem;
    for (lVar10 = 0; lVar10 <= pVVar1->iPage; lVar10 = lVar10 + 1) {
      pwVar4 = pVVar1->ppPages[lVar10];
      if (pwVar4 != (word *)0x0) {
        free(pwVar4);
        pVVar1->ppPages[lVar10] = (word *)0x0;
      }
    }
    free(pVVar1->ppPages);
    free(pVVar1);
  }
  if (p->pHash != (Hsh_IntMan_t *)0x0) {
    Vec_WrdFree(p->vPerm6);
    Vec_IntFree(p->vMap2Perm);
    Vec_IntFree(p->vConfgRes);
    Vec_IntFree(p->pHash->vData);
    __ptr = p->pHash;
    Vec_IntFree(__ptr->vTable);
    Vec_WrdFree(__ptr->vObjs);
    free(__ptr);
  }
  __ptr_00 = p->vNpnConfigs;
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    __ptr_04 = __ptr_00->pArray;
    lVar10 = 8;
    for (lVar12 = 0; lVar12 < __ptr_00->nCap; lVar12 = lVar12 + 1) {
      pvVar2 = *(void **)((long)&__ptr_04->nCap + lVar10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        __ptr_04 = __ptr_00->pArray;
        *(undefined8 *)((long)&__ptr_04->nCap + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    }
    free(__ptr_04);
    free(__ptr_00);
    p->vNpnConfigs = (Vec_Wec_t *)0x0;
  }
  __ptr_01 = p->vTemp;
  free(__ptr_01->pArray);
  free(__ptr_01);
  __ptr_02 = p->pManCuts;
  for (lVar10 = 0; lVar10 <= __ptr_02->uMask; lVar10 = lVar10 + 1) {
    lVar12 = lVar10 * 0x38;
    for (lVar9 = 0; pvVar2 = *(void **)((long)__ptr_02 + lVar12 + 0x38),
        lVar9 < *(int *)((long)__ptr_02 + lVar12 + 0x34); lVar9 = lVar9 + 1) {
      free(*(void **)((long)pvVar2 + lVar9 * 8));
    }
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)__ptr_02 + lVar12 + 0x38) = 0;
    }
    pvVar2 = *(void **)((long)__ptr_02 + lVar12 + 0x48);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)__ptr_02 + lVar12 + 0x48) = 0;
    }
  }
  free(__ptr_02);
  __ptr_03 = (p->vFreeUnits).pArray;
  if (__ptr_03 != (void **)0x0) {
    free(__ptr_03);
    (p->vFreeUnits).pArray = (void **)0x0;
  }
  piVar3 = (p->vCutBests).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vCutBests).pArray = (int *)0x0;
  }
  piVar3 = (p->vCutLists).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vCutLists).pArray = (int *)0x0;
  }
  piVar3 = (p->vMigRefs).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vMigRefs).pArray = (int *)0x0;
  }
  piVar3 = (p->vMapRefs).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vMapRefs).pArray = (int *)0x0;
  }
  piVar3 = (p->vEstRefs).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vEstRefs).pArray = (int *)0x0;
  }
  piVar3 = (p->vRequireds).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vRequireds).pArray = (int *)0x0;
  }
  piVar3 = (p->vTimes).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vTimes).pArray = (int *)0x0;
  }
  piVar3 = (p->vAreas).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vAreas).pArray = (int *)0x0;
  }
  free((p->vEdges).pArray);
  free(p);
  return;
}

Assistant:

void Mpm_ManStop( Mpm_Man_t * p )
{
    if ( p->pPars->fUseTruth && p->pPars->fVeryVerbose )
    {
        char * pFileName = "truths.txt";
        FILE * pFile = fopen( pFileName, "wb" );
        Vec_MemDump( pFile, p->vTtMem );
        fclose( pFile );
        printf( "Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n", 
            Vec_MemEntryNum(p->vTtMem), p->nLutSize, pFileName,
            (16.0 * p->nTruWords + 1.0) * Vec_MemEntryNum(p->vTtMem) / (1 << 20) );
    }
    if ( p->pPars->fUseDsd && p->pPars->fVerbose )
        Mpm_ManPrintDsdStats( p );
    if ( p->vTtMem ) 
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    if ( p->pHash )
    {
        Vec_WrdFree( p->vPerm6 );
        Vec_IntFree( p->vMap2Perm );
        Vec_IntFree( p->vConfgRes );
        Vec_IntFree( p->pHash->vData );
        Hsh_IntManStop( p->pHash );
    }
    Vec_WecFreeP( &p->vNpnConfigs );
    Vec_PtrFree( p->vTemp );
    Mmr_StepStop( p->pManCuts );
    ABC_FREE( p->vFreeUnits.pArray );
    // mapping attributes
    ABC_FREE( p->vCutBests.pArray );
    ABC_FREE( p->vCutLists.pArray );
    ABC_FREE( p->vMigRefs.pArray );
    ABC_FREE( p->vMapRefs.pArray );
    ABC_FREE( p->vEstRefs.pArray );
    ABC_FREE( p->vRequireds.pArray );
    ABC_FREE( p->vTimes.pArray );
    ABC_FREE( p->vAreas.pArray );
    ABC_FREE( p->vEdges.pArray );
    ABC_FREE( p );
}